

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_timer.c
# Opt level: O1

mfb_timer * mfb_timer_create(void)

{
  mfb_timer *pmVar1;
  uint64_t uVar2;
  
  if (mfb_timer_create_once == '\0') {
    mfb_timer_create_once = '\x01';
    mfb_timer_init();
  }
  pmVar1 = (mfb_timer *)malloc(0x18);
  if (pmVar1 != (mfb_timer *)0x0) {
    uVar2 = mfb_timer_tick();
    pmVar1->start_time = uVar2;
    pmVar1->delta_counter = uVar2;
    pmVar1->time = 0;
  }
  return pmVar1;
}

Assistant:

struct mfb_timer *
mfb_timer_create() {
    static int  once = 1;
    mfb_timer   *tmr;

    if(once) {
        once = 0;
        mfb_timer_init();
    }

    tmr = malloc(sizeof(mfb_timer));
    mfb_timer_reset(tmr);

    return tmr;
}